

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::strTree<char_const(&)[32],kj::String&,char_const(&)[3],kj::String&,char_const(&)[3]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [32],String *params_1,
          char (*params_2) [3],String *params_3,char (*params_4) [3])

{
  char (*value) [32];
  String *pSVar1;
  char (*pacVar2) [3];
  StringTree *__return_storage_ptr___00;
  ArrayPtr<const_char> local_88;
  ArrayPtr<const_char> local_78;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  String *local_38;
  char (*params_local_4) [3];
  String *params_local_3;
  char (*params_local_2) [3];
  String *params_local_1;
  char (*params_local) [32];
  
  __return_storage_ptr___00 = __return_storage_ptr__;
  local_38 = params_3;
  params_local_4 = params_2;
  params_local_3 = params_1;
  params_local_2 = (char (*) [3])params;
  params_local_1 = (String *)this;
  params_local = (char (*) [32])__return_storage_ptr__;
  value = ::const((char (*) [32])this);
  local_48 = _::toStringTreeOrCharSequence<char_const(&)[32]>(value);
  pSVar1 = fwd<kj::String&>((String *)params_local_2);
  local_58 = _::toStringTreeOrCharSequence<kj::String&>(pSVar1);
  pacVar2 = ::const((char (*) [3])params_local_3);
  local_68 = _::toStringTreeOrCharSequence<char_const(&)[3]>(pacVar2);
  pSVar1 = fwd<kj::String&>((String *)params_local_4);
  local_78 = _::toStringTreeOrCharSequence<kj::String&>(pSVar1);
  pacVar2 = ::const((char (*) [3])local_38);
  local_88 = _::toStringTreeOrCharSequence<char_const(&)[3]>(pacVar2);
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr___00,(StringTree *)&local_48,&local_58,&local_68,&local_78,
             &local_88,(ArrayPtr<const_char> *)__return_storage_ptr___00);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}